

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDEdgePtr ON_SubDEdgePtr::CreateFromStartVertex(ON_SubDEdge *edge,ON_SubDVertex *start_vertex)

{
  bool bVar1;
  ulong uVar2;
  ON_SubDVertex *pOVar3;
  
  if (start_vertex == (ON_SubDVertex *)0x0 || edge == (ON_SubDEdge *)0x0) {
    return (ON_SubDEdgePtr)0;
  }
  pOVar3 = edge->m_vertex[1];
  if (edge->m_vertex[0] == pOVar3) {
    return (ON_SubDEdgePtr)0;
  }
  if (edge->m_vertex[0] == start_vertex) {
    uVar2 = 0;
  }
  else {
    if (pOVar3 != start_vertex) {
      bVar1 = true;
      goto LAB_005cef17;
    }
    uVar2 = 1;
  }
  pOVar3 = (ON_SubDVertex *)(uVar2 | (ulong)edge);
  bVar1 = false;
LAB_005cef17:
  if (bVar1) {
    return (ON_SubDEdgePtr)0;
  }
  return (ON_SubDEdgePtr)(ON__UINT_PTR)pOVar3;
}

Assistant:

const ON_SubDEdgePtr ON_SubDEdgePtr::CreateFromStartVertex(
  const class ON_SubDEdge* edge,
  const ON_SubDVertex* start_vertex
)
{
  for (;;)
  {
    if (nullptr == edge || nullptr == start_vertex)
      break;
    if (edge->m_vertex[0] == edge->m_vertex[1])
      break;
    
    ON__UINT_PTR dir;
    if (start_vertex == edge->m_vertex[0])
      dir = 0;
    else if (start_vertex == edge->m_vertex[1])
      dir = 1;
    else
      break;
    return ON_SubDEdgePtr::Create(edge, dir);
  }
  return ON_SubDEdgePtr::Null;
}